

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

int __thiscall minihttp::TcpSocket::open(TcpSocket *this,char *__file,int __oflag,...)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  int __fd;
  long local_30;
  SOCKET s;
  char *pcStack_20;
  uint port_local;
  char *host_local;
  TcpSocket *this_local;
  ulong uVar3;
  string *__rhs;
  
  s._4_4_ = __oflag;
  pcStack_20 = __file;
  host_local = (char *)this;
  bVar1 = isOpen(this);
  __fd = (int)__file;
  uVar3 = CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    if (pcStack_20 == (char *)0x0) {
LAB_00111d12:
      if ((s._4_4_ == 0) || (uVar3 = (ulong)s._4_4_, s._4_4_ == this->_lastport)) {
        this_local._7_1_ = 1;
        goto LAB_00111e17;
      }
    }
    else {
      __rhs = &this->_host;
      bVar1 = std::operator!=(pcStack_20,__rhs);
      __fd = (int)__rhs;
      uVar3 = CONCAT71(extraout_var_00,bVar1);
      if (!bVar1) goto LAB_00111d12;
    }
    close(this,__fd);
  }
  if (pcStack_20 == (char *)0x0) {
    pcStack_20 = (char *)std::__cxx11::string::c_str();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->_host,pcStack_20);
  }
  if (s._4_4_ == 0) {
    s._4_4_ = this->_lastport;
    uVar3 = (ulong)s._4_4_;
    if (s._4_4_ == 0) {
      this_local._7_1_ = 0;
      goto LAB_00111e17;
    }
  }
  else {
    this->_lastport = s._4_4_;
  }
  if (this->_s != -1) {
    __assert_fail("!SOCKETVALID(_s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                  ,0x204,"bool minihttp::TcpSocket::open(const char *, unsigned int)");
  }
  this->_recvSize = 0;
  bVar1 = _openSocket(&local_30,pcStack_20,s._4_4_);
  uVar3 = CONCAT71(extraout_var_01,bVar1);
  if (bVar1) {
    this->_s = local_30;
    _SetNonBlocking(this->_s,(bool)(this->_nonblocking & 1));
    uVar2 = (*this->_vptr_TcpSocket[7])();
    uVar3 = (ulong)uVar2;
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00111e17:
  return (int)CONCAT71((int7)(uVar3 >> 8),this_local._7_1_);
}

Assistant:

bool TcpSocket::open(const char *host /* = NULL */, unsigned int port /* = 0 */)
{
    if(isOpen())
    {
        if( (host && host != _host) || (port && port != _lastport) )
            close();
            // ... and continue connecting to new host/port
        else
            return true; // still connected, to same host and port.
    }

    if(host)
        _host = host;
    else
        host = _host.c_str();

    if(port)
        _lastport = port;
    else
    {
        port = _lastport;
        if(!port)
            return false;
    }

    traceprint("TcpSocket::open(): host = [%s], port = %d\n", host, port);

    assert(!SOCKETVALID(_s));

    _recvSize = 0;

    {
        SOCKET s;
        if(!_openSocket(&s, host, port))
            return false;
        _s = s;

#ifdef SO_NOSIGPIPE
        // Don't fire SIGPIPE when trying to write to a closed socket
        {
            int set = 1;
            setsockopt(s, SOL_SOCKET, SO_NOSIGPIPE, (void *)&set, sizeof(int));
        }
#endif

    }

    _SetNonBlocking(_s, _nonblocking); // restore setting if it was set in invalid state. static call because _s is intentionally still invalid here.

#ifdef MINIHTTP_USE_MBEDTLS
    if(_sslctx)
    {
        traceprint("TcpSocket::open(): SSL requested...\n");
        if(!_openSSL(&_s, (SSLCtx*)_sslctx))
        {
            close();
            return false;
        }
    }
#endif

    _OnOpen();

    return true;
}